

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_c7e9::BlockCopy<signed_char>::Run
          (BlockCopy<signed_char> *this,istream *input_stream)

{
  bool bVar1;
  _Setprecision _Var2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  ostream *poVar6;
  istream *in_RSI;
  long in_RDI;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  int i_3;
  int i_2;
  int i_1;
  invalid_argument *anon_var_0;
  string word;
  int i;
  bool halt;
  char *inputs;
  char *pads;
  vector<signed_char,_std::allocator<signed_char>_> input_data;
  vector<signed_char,_std::allocator<signed_char>_> pad_data;
  int right_pad_length;
  int left_pad_length;
  int copy_length;
  size_t *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  allocator_type *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined6 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeee;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_fffffffffffffef0;
  string *this_00;
  undefined1 *puVar8;
  value_type local_d2;
  int local_d0;
  int local_c8;
  int local_c4;
  string local_b0 [32];
  int local_90;
  byte local_89;
  reference local_88;
  reference local_80;
  undefined1 local_71;
  vector<signed_char,_std::allocator<signed_char>_> local_70 [2];
  vector<signed_char,_std::allocator<signed_char>_> local_40;
  int local_24;
  int local_20;
  int local_1c;
  istream *local_18;
  byte local_1;
  
  local_1c = (*(int *)(in_RDI + 0xc) - *(int *)(in_RDI + 8)) + 1;
  local_20 = *(int *)(in_RDI + 0x14);
  local_24 = (*(int *)(in_RDI + 0x18) - *(int *)(in_RDI + 0x14)) - local_1c;
  local_18 = in_RSI;
  piVar3 = std::max<int>(&local_20,&local_24);
  piVar3 = (int *)(long)*piVar3;
  std::allocator<signed_char>::allocator((allocator<signed_char> *)0x109077);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
             ,(value_type *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::allocator<signed_char>::~allocator((allocator<signed_char> *)0x1090a2);
  lVar4 = (long)*(int *)(in_RDI + 0x10);
  puVar8 = &local_71;
  std::allocator<signed_char>::allocator((allocator<signed_char> *)0x1090c2);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
             ,(allocator_type *)in_stack_fffffffffffffec0);
  std::allocator<signed_char>::~allocator((allocator<signed_char> *)0x1090e8);
  if ((*(byte *)(in_RDI + 0x1d) & 1) == 0) {
    do {
      bVar1 = sptk::ReadStream<signed_char>
                        (SUB81((ulong)puVar8 >> 0x30,0),(int)puVar8,(int)((ulong)lVar4 >> 0x20),
                         (int)lVar4,in_stack_fffffffffffffef0,
                         (istream *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),
                         piVar3);
      if (!bVar1) goto LAB_00109664;
      if ((0 < local_20) &&
         (bVar1 = sptk::WriteStream<signed_char>
                            ((int)puVar8,(int)((ulong)lVar4 >> 0x20),in_stack_fffffffffffffef0,
                             (ostream *)
                             CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),
                             (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)),
         !bVar1)) {
        local_1 = 0;
        goto LAB_00109677;
      }
      bVar1 = sptk::WriteStream<signed_char>
                        ((int)puVar8,(int)((ulong)lVar4 >> 0x20),in_stack_fffffffffffffef0,
                         (ostream *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),
                         (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if (!bVar1) {
        local_1 = 0;
        goto LAB_00109677;
      }
    } while ((local_24 < 1) ||
            (bVar1 = sptk::WriteStream<signed_char>
                               ((int)puVar8,(int)((ulong)lVar4 >> 0x20),in_stack_fffffffffffffef0,
                                (ostream *)
                                CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),
                                (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                               ), bVar1));
    local_1 = 0;
  }
  else {
    local_80 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](&local_40,0);
    local_88 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](local_70,0);
    local_89 = 0;
    while (((local_89 ^ 0xff) & 1) != 0) {
      for (local_90 = 0; local_90 < *(int *)(in_RDI + 0x10); local_90 = local_90 + 1) {
        this_00 = local_b0;
        std::__cxx11::string::string(this_00);
        std::operator>>(local_18,this_00);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          lVar7 = in_ST0;
          if ((*(int *)(in_RDI + 8) <= local_90) && (local_90 <= *(int *)(in_RDI + 0xc))) {
            lVar7 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = in_ST6;
            in_ST6 = in_ST7;
            std::__cxx11::stold((string *)
                                CONCAT17(in_stack_fffffffffffffeb7,
                                         CONCAT16(in_stack_fffffffffffffeb6,
                                                  CONCAT15(in_stack_fffffffffffffeb5,
                                                           CONCAT14(in_stack_fffffffffffffeb4,
                                                                    in_stack_fffffffffffffeb0)))),
                                in_stack_fffffffffffffea8);
            local_d2 = (value_type)(short)ROUND(in_ST0);
            local_88[local_90] = local_d2;
            in_ST7 = in_ST6;
          }
          bVar1 = false;
          in_ST0 = lVar7;
        }
        else {
          local_89 = 1;
          bVar1 = true;
        }
        std::__cxx11::string::~string(local_b0);
        if (bVar1) {
          if (!bVar1) goto LAB_00109677;
          break;
        }
      }
      if ((local_89 & 1) != 0) break;
      for (local_c4 = 0; local_c4 < local_20; local_c4 = local_c4 + 1) {
        poVar6 = std::operator<<(&std::cout,(int)local_80[local_c4]);
        std::operator<<(poVar6," ");
      }
      for (local_c8 = *(int *)(in_RDI + 8); local_c8 <= *(int *)(in_RDI + 0xc);
          local_c8 = local_c8 + 1) {
        _Var2 = std::setprecision(0x13);
        poVar6 = std::operator<<((ostream *)&std::cout,_Var2);
        in_stack_fffffffffffffec0 = std::operator<<(poVar6,(int)local_88[local_c8]);
        std::operator<<(in_stack_fffffffffffffec0," ");
      }
      for (local_d0 = 0; local_d0 < local_24; local_d0 = local_d0 + 1) {
        poVar6 = std::operator<<(&std::cout,(int)local_80[local_d0]);
        std::operator<<(poVar6," ");
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
LAB_00109664:
    local_1 = 1;
  }
LAB_00109677:
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffffec0);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffffec0);
  return (bool)(local_1 & 1);
}

Assistant:

bool Run(std::istream* input_stream) const override {
    const int copy_length(input_end_number_ - input_start_number_ + 1);
    const int left_pad_length(output_start_number_);
    const int right_pad_length(output_block_length_ - output_start_number_ -
                               copy_length);

    std::vector<T> pad_data(std::max(left_pad_length, right_pad_length),
                            pad_value_);
    std::vector<T> input_data(input_block_length_);

    if (is_ascii_) {
      T* pads(&(pad_data[0]));
      T* inputs(&(input_data[0]));
      bool halt(false);
      while (!halt) {
        // Read data.
        for (int i(0); i < input_block_length_; ++i) {
          std::string word;
          *input_stream >> word;
          if (word.empty()) {
            halt = true;
            break;
          }
          if (input_start_number_ <= i && i <= input_end_number_) {
            try {
              inputs[i] = static_cast<T>(std::stold(word));
            } catch (std::invalid_argument&) {
              return false;
            }
          }
        }
        if (halt) break;

        // Write data.
        for (int i(0); i < left_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        for (int i(input_start_number_); i <= input_end_number_; ++i) {
          std::cout << std::setprecision(
                           std::numeric_limits<long double>::digits10 + 1)
                    << inputs[i] << " ";
        }
        for (int i(0); i < right_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        std::cout << std::endl;
      }
    } else {
      while (sptk::ReadStream(false, 0, 0, input_block_length_, &input_data,
                              input_stream, NULL)) {
        if (0 < left_pad_length &&
            !sptk::WriteStream(0, left_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
        if (!sptk::WriteStream(input_start_number_, copy_length, input_data,
                               &std::cout, NULL)) {
          return false;
        }
        if (0 < right_pad_length &&
            !sptk::WriteStream(0, right_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
      }
    }

    return true;
  }